

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O2

int __thiscall
QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
::remove(QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
         *this,char *__filename)

{
  bool bVar1;
  undefined7 extraout_var;
  iterator it;
  
  it = find(this,(QPushButton **)__filename);
  bVar1 = do_remove(this,it);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool remove(const Key &key)
    {
        return do_remove(find(key));
    }